

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O0

void golf_gi_deinit(golf_gi_t *gi)

{
  golf_gi_lightmap_section_t *pgVar1;
  golf_gi_entity_t *pgVar2;
  golf_gi_lightmap_section_t *section;
  int i_1;
  golf_gi_entity_t *entity;
  int i;
  golf_gi_t *gi_local;
  
  for (entity._4_4_ = 0; entity._4_4_ < (gi->entities).length; entity._4_4_ = entity._4_4_ + 1) {
    pgVar2 = (gi->entities).data + entity._4_4_;
    for (section._4_4_ = 0; section._4_4_ < (pgVar2->gi_lightmap_sections).length;
        section._4_4_ = section._4_4_ + 1) {
      pgVar1 = (pgVar2->gi_lightmap_sections).data;
      golf_free_tracked(pgVar1[section._4_4_].positions.data);
      golf_free_tracked(pgVar1[section._4_4_].normals.data);
      golf_free_tracked(pgVar1[section._4_4_].lightmap_uvs.data);
    }
    golf_free_tracked((pgVar2->gi_lightmap_sections).data);
    golf_free_tracked((pgVar2->positions).data);
    golf_free_tracked((pgVar2->normals).data);
    golf_free_tracked((pgVar2->lightmap_uvs).data);
    golf_free_tracked((pgVar2->ignore).data);
  }
  golf_free_tracked((gi->entities).data);
  golf_thread_join(gi->thread);
  golf_thread_destroy(gi->thread);
  return;
}

Assistant:

void golf_gi_deinit(golf_gi_t *gi) {
    for (int i = 0; i < gi->entities.length; i++) {
        golf_gi_entity_t *entity = &gi->entities.data[i];
        for (int i = 0; i < entity->gi_lightmap_sections.length; i++) {
            golf_gi_lightmap_section_t *section = &entity->gi_lightmap_sections.data[i];
            vec_deinit(&section->positions);
            vec_deinit(&section->normals);
            vec_deinit(&section->lightmap_uvs);
        }
        vec_deinit(&entity->gi_lightmap_sections);
        vec_deinit(&entity->positions);
        vec_deinit(&entity->normals);
        vec_deinit(&entity->lightmap_uvs);
        vec_deinit(&entity->ignore);
    }
    vec_deinit(&gi->entities);
    golf_thread_join(gi->thread);
    golf_thread_destroy(gi->thread);
}